

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallSet.h
# Opt level: O0

VIterator __thiscall
llvm::SmallSet<std::pair<int,_int>,_32U,_std::less<std::pair<int,_int>_>_>::vfind
          (SmallSet<std::pair<int,_int>,_32U,_std::less<std::pair<int,_int>_>_> *this,
          pair<int,_int> *V)

{
  void *pvVar1;
  bool bVar2;
  size_t sVar3;
  VIterator E;
  VIterator I;
  pair<int,_int> *V_local;
  SmallSet<std::pair<int,_int>,_32U,_std::less<std::pair<int,_int>_>_> *this_local;
  
  E = (VIterator)
      (this->Vector).super_SmallVectorImpl<std::pair<int,_int>_>.
      super_SmallVectorTemplateBase<std::pair<int,_int>,_true>.
      super_SmallVectorTemplateCommon<std::pair<int,_int>,_void>.super_SmallVectorBase.BeginX;
  pvVar1 = (this->Vector).super_SmallVectorImpl<std::pair<int,_int>_>.
           super_SmallVectorTemplateBase<std::pair<int,_int>,_true>.
           super_SmallVectorTemplateCommon<std::pair<int,_int>,_void>.super_SmallVectorBase.BeginX;
  sVar3 = SmallVectorBase::size((SmallVectorBase *)this);
  while( true ) {
    if (E == (VIterator)((long)pvVar1 + sVar3 * 8)) {
      pvVar1 = (this->Vector).super_SmallVectorImpl<std::pair<int,_int>_>.
               super_SmallVectorTemplateBase<std::pair<int,_int>,_true>.
               super_SmallVectorTemplateCommon<std::pair<int,_int>,_void>.super_SmallVectorBase.
               BeginX;
      sVar3 = SmallVectorBase::size((SmallVectorBase *)this);
      return (VIterator)((long)pvVar1 + sVar3 * 8);
    }
    bVar2 = std::operator==(E,V);
    if (bVar2) break;
    E = E + 1;
  }
  return E;
}

Assistant:

VIterator vfind(const T &V) const {
    for (VIterator I = Vector.begin(), E = Vector.end(); I != E; ++I)
      if (*I == V)
        return I;
    return Vector.end();
  }